

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O0

void __thiscall Half_Basics_Test::TestBody(Half_Basics_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  float fVar4;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  Half h;
  uint32_t bits;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  AssertionResult *in_stack_fffffffffffffd10;
  Half *in_stack_fffffffffffffd18;
  Half *in_stack_fffffffffffffd20;
  AssertionResult *in_stack_fffffffffffffd28;
  int line;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  char *in_stack_fffffffffffffd38;
  AssertHelper *in_stack_fffffffffffffd40;
  AssertHelper *this_00;
  char *in_stack_fffffffffffffd70;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  Half *this_02;
  Message *in_stack_fffffffffffffd88;
  AssertionResult *this_03;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  Half local_1d4;
  uint16_t local_1d2;
  AssertionResult local_1d0 [2];
  uint16_t local_1ac;
  uint16_t local_1aa;
  AssertionResult local_1a8;
  undefined8 local_196;
  Half local_15a;
  AssertionResult local_158;
  string local_148 [54];
  Half local_112;
  AssertionResult local_110;
  string local_100 [54];
  Half local_ca;
  AssertionResult local_c8 [2];
  Half local_a4;
  uint16_t local_a2;
  AssertionResult local_a0 [2];
  Half local_7c;
  uint16_t local_7a;
  AssertionResult local_78 [2];
  Half local_54;
  uint16_t local_52;
  AssertionResult local_50 [3];
  Half local_1c;
  uint16_t local_1a;
  AssertionResult local_18;
  
  pbrt::Half::Half(&local_1c,0.0);
  local_1a = pbrt::Half::Bits(&local_1c);
  testing::internal::EqHelper<false>::Compare<unsigned_short,int>
            (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
             &in_stack_fffffffffffffd18->h,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::AssertionResult::failure_message((AssertionResult *)0x5b04cc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    testing::Message::~Message((Message *)0x5b052f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b0587);
  pbrt::Half::Half(&local_54,-0.0);
  local_52 = pbrt::Half::Bits(&local_54);
  testing::internal::EqHelper<false>::Compare<unsigned_short,int>
            (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
             &in_stack_fffffffffffffd18->h,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::AssertionResult::failure_message((AssertionResult *)0x5b065a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    testing::Message::~Message((Message *)0x5b06bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b0715);
  pbrt::Half::Half(&local_7c,INFINITY);
  local_7a = pbrt::Half::Bits(&local_7c);
  testing::internal::EqHelper<false>::Compare<unsigned_short,int>
            (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
             &in_stack_fffffffffffffd18->h,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::AssertionResult::failure_message((AssertionResult *)0x5b07e8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    testing::Message::~Message((Message *)0x5b084b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b08a3);
  pbrt::Half::Half(&local_a4,-INFINITY);
  local_a2 = pbrt::Half::Bits(&local_a4);
  testing::internal::EqHelper<false>::Compare<unsigned_short,int>
            (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
             &in_stack_fffffffffffffd18->h,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::AssertionResult::failure_message((AssertionResult *)0x5b0976);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    testing::Message::~Message((Message *)0x5b09d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b0a2e);
  fVar4 = std::numeric_limits<float>::quiet_NaN();
  this_02 = &local_ca;
  pbrt::Half::Half(this_02,fVar4);
  pbrt::Half::IsNaN(this_02);
  this_03 = local_c8;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd10,(bool)in_stack_fffffffffffffd0f);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_03,(char *)this_02,
               (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd90),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_100);
    testing::Message::~Message((Message *)0x5b0b63);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b0bdb);
  fVar4 = std::numeric_limits<float>::quiet_NaN();
  pbrt::Half::Half(&local_112,fVar4);
  pbrt::Half::IsNaN(&local_112);
  this_01 = &local_110;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd10,(bool)in_stack_fffffffffffffd0f);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_03,(char *)this_02,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd78),
               &this_01->success_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd90),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_148);
    testing::Message::~Message((Message *)0x5b0d04);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b0d7c);
  local_15a = pbrt::Half::FromBits(0);
  pbrt::Half::IsNaN(&local_15a);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd10,(bool)in_stack_fffffffffffffd0f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_03,(char *)this_02,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd78),
               &this_01->success_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd90),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    std::__cxx11::string::~string((string *)((long)&local_196 + 6));
    testing::Message::~Message((Message *)0x5b0ea5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b0f1d);
  for (local_196._2_4_ = 0; local_196._2_4_ < 0x10000; local_196._2_4_ = local_196._2_4_ + 1) {
    local_196._0_2_ = pbrt::Half::FromBits(0);
    bVar1 = pbrt::Half::IsInf((Half *)&local_196);
    if ((!bVar1) && (bVar1 = pbrt::Half::IsNaN((Half *)&local_196), !bVar1)) {
      this_00 = (AssertHelper *)&local_196;
      local_1ac = (uint16_t)
                  pbrt::Half::operator-
                            ((Half *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
      local_1aa = (uint16_t)
                  pbrt::Half::operator-
                            ((Half *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
      testing::internal::EqHelper<false>::Compare<pbrt::Half,pbrt::Half>
                (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
                 in_stack_fffffffffffffd18,(Half *)in_stack_fffffffffffffd10);
      line = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffd38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x5b103b);
        testing::internal::AssertHelper::AssertHelper
                  (this_00,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),line,
                   (char *)in_stack_fffffffffffffd20);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd90),(Message *)this_03);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
        testing::Message::~Message((Message *)0x5b1098);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b10f0);
      in_stack_fffffffffffffd18 = (Half *)&local_196;
      local_1d2 = (uint16_t)
                  pbrt::Half::operator-
                            ((Half *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
      fVar4 = pbrt::Half::operator_cast_to_float(in_stack_fffffffffffffd18);
      in_stack_fffffffffffffd20 = &local_1d4;
      pbrt::Half::Half(in_stack_fffffffffffffd20,-fVar4);
      in_stack_fffffffffffffd28 = local_1d0;
      testing::internal::EqHelper<false>::Compare<pbrt::Half,pbrt::Half>
                (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
                 in_stack_fffffffffffffd18,(Half *)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd37 =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd28);
      if (!(bool)in_stack_fffffffffffffd37) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffd10 =
             (AssertionResult *)
             testing::AssertionResult::failure_message((AssertionResult *)0x5b11c6);
        testing::internal::AssertHelper::AssertHelper
                  (this_00,(Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                   (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd90),(Message *)this_03);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
        testing::Message::~Message((Message *)0x5b1223);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b1278);
    }
  }
  return;
}

Assistant:

TEST(Half, Basics) {
    EXPECT_EQ(Half(0.f).Bits(), HalfPositiveZero);
    EXPECT_EQ(Half(-0.f).Bits(), HalfNegativeZero);
    EXPECT_EQ(Half(Infinity).Bits(), HalfPositiveInfinity);
    EXPECT_EQ(Half(-Infinity).Bits(), HalfNegativeInfinity);

    EXPECT_TRUE(Half(std::numeric_limits<Float>::quiet_NaN()).IsNaN());
    EXPECT_TRUE(Half(std::numeric_limits<Float>::quiet_NaN()).IsNaN());
    EXPECT_FALSE(Half::FromBits(HalfPositiveInfinity).IsNaN());

    for (uint32_t bits = 0; bits < 65536; ++bits) {
        Half h = Half::FromBits(bits);
        if (h.IsInf() || h.IsNaN())
            continue;
        EXPECT_EQ(h, -(-h));
        EXPECT_EQ(-h, Half(-float(h)));
    }
}